

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O3

void crnlib::FillAlignPrices(CLzmaEnc *p)

{
  UInt32 i;
  ulong uVar1;
  UInt32 m;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  UInt32 price;
  UInt32 UVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = 0;
  do {
    uVar2 = 1;
    iVar3 = -4;
    uVar4 = uVar1 & 0xffffffff;
    UVar5 = 0;
    do {
      uVar6 = (uint)uVar4 & 1;
      uVar7 = (ulong)uVar2;
      uVar2 = uVar6 + uVar2 * 2;
      uVar4 = uVar4 >> 1;
      UVar5 = UVar5 + p->ProbPrices[(-uVar6 & 0x7f0 ^ (uint)p->posAlignEncoder[uVar7]) >> 4];
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0);
    p->alignPrices[uVar1] = UVar5;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x10);
  p->alignPriceCount = 0;
  return;
}

Assistant:

static void FillAlignPrices(CLzmaEnc* p) {
  UInt32 i;
  for (i = 0; i < kAlignTableSize; i++)
    p->alignPrices[i] = RcTree_ReverseGetPrice(p->posAlignEncoder, kNumAlignBits, i, p->ProbPrices);
  p->alignPriceCount = 0;
}